

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  float fVar1;
  uint uVar2;
  int n;
  float *pfVar3;
  ulong uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      auVar6 = vmaxss_avx(ZEXT416((uint)(items->Width - width_excess)),ZEXT416(0x3f800000));
      items->Width = auVar6._0_4_;
    }
  }
  else {
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    auVar7 = ZEXT464((uint)width_excess);
    uVar2 = 1;
    do {
      if ((count <= (int)uVar2) || (fVar5 = auVar7._0_4_, fVar5 <= 0.0)) break;
      pfVar3 = &items[(int)uVar2].Width;
      do {
        fVar1 = *pfVar3;
        if (fVar1 < items->Width) {
          if (0.0 <= fVar1) {
            fVar1 = items->Width - fVar1;
            goto LAB_0016c8f5;
          }
          break;
        }
        uVar2 = uVar2 + 1;
        pfVar3 = pfVar3 + 2;
      } while (count != uVar2);
      fVar1 = items->Width + -1.0;
LAB_0016c8f5:
      if (0.0 < fVar1) {
        auVar6._0_4_ = fVar5 / (float)(int)uVar2;
        auVar6._4_12_ = auVar7._4_12_;
        auVar6 = vminss_avx(auVar6,ZEXT416((uint)fVar1));
        if (0 < (int)uVar2) {
          uVar4 = 0;
          do {
            items[uVar4].Width = items[uVar4].Width - auVar6._0_4_;
            uVar4 = uVar4 + 1;
          } while (uVar2 != uVar4);
        }
        auVar7 = ZEXT464((uint)(fVar5 - auVar6._0_4_ * (float)(int)uVar2));
      }
    } while (0.0 < fVar1);
    fVar5 = 0.0;
    if (0 < count) {
      uVar4 = 0;
      fVar5 = 0.0;
      do {
        auVar6 = vcvtdq2ps_avx(ZEXT416((uint)(int)items[uVar4].Width));
        fVar5 = fVar5 + (items[uVar4].Width - auVar6._0_4_);
        items[uVar4].Width = auVar6._0_4_;
        uVar4 = uVar4 + 1;
      } while ((uint)count != uVar4);
    }
    if (0 < count && 0.0 < fVar5) {
      uVar4 = 0;
      do {
        if (items[uVar4].Index < (int)(fVar5 + 0.01)) {
          items[uVar4].Width = items[uVar4].Width + 1.0;
        }
        uVar4 = uVar4 + 1;
      } while ((uint)count != uVar4);
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}